

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_token_stream.c
# Opt level: O3

l2_token * l2_token_stream_next_token(l2_token_stream *token_stream_p)

{
  int cols;
  byte bVar1;
  boolean bVar2;
  char cVar3;
  int iVar4;
  l2_token *plVar5;
  char *pcVar6;
  ulong uVar7;
  l2_parsing_error_type lVar8;
  l2_char_stream *char_stream_p;
  uint uVar9;
  long lVar10;
  char seq [4];
  l2_token t;
  l2_string token_str_buff;
  byte local_7c [4];
  undefined4 local_78;
  undefined4 uStack_74;
  l2_string lStack_70;
  undefined8 local_58;
  int iStack_50;
  undefined4 uStack_4c;
  l2_string local_48;
  
  l2_assert_func((long)token_stream_p,L2_INTERNAL_ERROR_NULL_POINTER,"l2_token_stream_next_token",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/AloneCafe[P]l2/l2_parser/l2_token_stream.c"
                 ,0x35);
  iVar4 = token_stream_p->token_vector_current_pos;
  if ((ulong)(long)iVar4 < (token_stream_p->token_vector).size) {
    token_stream_p->token_vector_current_pos = iVar4 + 1;
    plVar5 = (l2_token *)l2_vector_at(&token_stream_p->token_vector,iVar4);
    return plVar5;
  }
  local_58 = 0;
  iStack_50 = 0;
  uStack_4c = 0;
  lStack_70.len = 0;
  lStack_70.max_len = 0;
  local_78 = 0;
  uStack_74 = 0;
  lStack_70.str_p = (char *)0x0;
  l2_string_create(&local_48);
  uVar9 = 0;
switchD_001029ad_caseD_9:
  bVar1 = l2_char_stream_next_char(token_stream_p->char_stream_p);
  char_stream_p = token_stream_p->char_stream_p;
  iVar4 = char_stream_p->lines;
  cols = char_stream_p->cols;
  if (0x20 < uVar9) {
    if (0x4f < uVar9) {
      if (uVar9 < 0x400) {
        if (uVar9 == 0x50) {
          if (bVar1 < 0x62) {
            if (bVar1 < 0x3f) {
              if (bVar1 == 0x22) {
                bVar1 = 0x22;
              }
              else {
                if (bVar1 != 0x27) goto switchD_00102739_caseD_6f;
                bVar1 = 0x27;
              }
            }
            else if (bVar1 == 0x3f) {
              bVar1 = 0x3f;
            }
            else if (bVar1 == 0x5c) {
              bVar1 = 0x5c;
            }
            else {
              if (bVar1 != 0x61) goto switchD_00102739_caseD_6f;
              bVar1 = 7;
            }
          }
          else {
            switch(bVar1) {
            case 0x6e:
              bVar1 = 10;
              break;
            case 0x6f:
            case 0x70:
            case 0x71:
            case 0x73:
            case 0x75:
switchD_00102739_caseD_6f:
              if ((bVar1 & 0xf8) == 0x30) {
                lVar10 = 1;
                do {
                  bVar1 = l2_char_stream_next_char(token_stream_p->char_stream_p);
                  if ((bVar1 & 0xf8) != 0x30) {
                    local_7c[lVar10] = 0;
                    l2_char_stream_rollback(token_stream_p->char_stream_p);
                    goto LAB_00102a63;
                  }
                  local_7c[lVar10] = bVar1;
                  lVar10 = lVar10 + 1;
                } while (lVar10 != 3);
                lVar10 = 3;
LAB_00102a63:
                local_7c[lVar10] = 0;
                iVar4 = l2_cast_octal_str_to_int((char *)local_7c);
                bVar1 = (byte)iVar4;
              }
              else if (bVar1 == 0x78) {
                local_7c[0] = l2_char_stream_next_char(char_stream_p);
                local_7c[1] = 0;
                if ((9 < (byte)(local_7c[0] - 0x30)) &&
                   ((0x25 < local_7c[0] - 0x41 ||
                    ((0x3f0000003fU >> ((ulong)(local_7c[0] - 0x41) & 0x3f) & 1) == 0)))) {
                  l2_char_stream_rollback(token_stream_p->char_stream_p);
                  l2_parsing_warning(L2_PARSING_WARNING_UNKNOWN_ESCAPE_SEQUENCE,iVar4,cols,local_7c)
                  ;
                  l2_string_push_char(&local_48,local_7c[0]);
                }
                local_7c[1] = l2_char_stream_next_char(token_stream_p->char_stream_p);
                if (((byte)(local_7c[1] - 0x30) < 10) ||
                   ((local_7c[1] - 0x41 < 0x26 &&
                    ((0x3f0000003fU >> ((ulong)(local_7c[1] - 0x41) & 0x3f) & 1) != 0)))) {
                  local_7c[2] = 0;
                }
                else {
                  local_7c[1] = 0;
                  l2_char_stream_rollback(token_stream_p->char_stream_p);
                }
                iVar4 = l2_cast_hex_str_to_int((char *)local_7c);
                bVar1 = (byte)iVar4;
              }
              else {
                if (bVar1 == 0xff) goto LAB_00103124;
                local_7c[1] = 0;
                local_7c[0] = bVar1;
                l2_parsing_warning(L2_PARSING_WARNING_UNKNOWN_ESCAPE_SEQUENCE,iVar4,cols,local_7c);
              }
              break;
            case 0x72:
              bVar1 = 0xd;
              break;
            case 0x74:
              bVar1 = 9;
              break;
            case 0x76:
              bVar1 = 0xb;
              break;
            default:
              if (bVar1 == 0x62) {
                bVar1 = 8;
              }
              else {
                if (bVar1 != 0x66) goto switchD_00102739_caseD_6f;
                bVar1 = 0xc;
              }
            }
          }
LAB_001026b2:
          l2_string_push_char(&local_48,bVar1);
          uVar9 = 0x500;
        }
        else if (uVar9 == 0x200) {
          if (((byte)(bVar1 - 0x30) < 10) ||
             ((bVar1 - 0x41 < 0x26 && ((0x3f0000003fU >> ((ulong)(bVar1 - 0x41) & 0x3f) & 1) != 0)))
             ) goto LAB_0010250c;
          pcVar6 = l2_string_get_str_p(&local_48);
          iVar4 = l2_cast_hex_str_to_int(pcVar6 + 2);
LAB_00102ccc:
          lStack_70.str_p = (char *)CONCAT44(lStack_70.str_p._4_4_,iVar4);
          goto LAB_00102cd0;
        }
      }
      else if (uVar9 == 0x500) {
        uVar9 = 0x50;
        if (bVar1 != 0x5c) {
          if (bVar1 != 0x22) goto LAB_001026a0;
          goto LAB_00102d00;
        }
      }
      else if (uVar9 == 0x400) {
        if (bVar1 != 0x27) {
          if (bVar1 != 0xff) {
            lVar8 = L2_PARSING_ERROR_MULTI_CHARACTER_IN_SINGLE_CHARACTER_LITERAL;
            goto LAB_00103149;
          }
          goto LAB_00103144;
        }
        pcVar6 = l2_string_get_str_p(&local_48);
        lStack_70.str_p = (char *)CONCAT44(lStack_70.str_p._4_4_,(int)*pcVar6);
        goto LAB_00102d15;
      }
      goto switchD_001029ad_caseD_9;
    }
    if (uVar9 < 0x32) {
      if (uVar9 == 0x21) {
        if ((byte)(bVar1 - 0x30) < 10) goto LAB_001026ca;
        pcVar6 = l2_string_get_str_p(&local_48);
        iVar4 = l2_cast_octal_str_to_int(pcVar6 + 1);
        goto LAB_00102ccc;
      }
      if (uVar9 != 0x31) goto switchD_001029ad_caseD_9;
      if (9 < (byte)(bVar1 - 0x30)) {
        lVar8 = L2_PARSING_ERROR_INCOMPLETE_REAL_LITERAL;
        goto LAB_00103149;
      }
    }
    else {
      if (uVar9 != 0x32) {
        if (uVar9 == 0x40) {
          if (bVar1 < 0x62) {
            if (bVar1 < 0x3f) {
              if (bVar1 == 0x22) {
                bVar1 = 0x22;
              }
              else {
                if (bVar1 != 0x27) goto switchD_00102710_caseD_6f;
                bVar1 = 0x27;
              }
            }
            else if (bVar1 == 0x3f) {
              bVar1 = 0x3f;
            }
            else if (bVar1 == 0x5c) {
              bVar1 = 0x5c;
            }
            else {
              if (bVar1 != 0x61) goto switchD_00102710_caseD_6f;
              bVar1 = 7;
            }
          }
          else {
            switch(bVar1) {
            case 0x6e:
              bVar1 = 10;
              break;
            case 0x6f:
            case 0x70:
            case 0x71:
            case 0x73:
            case 0x75:
switchD_00102710_caseD_6f:
              if ((bVar1 & 0xf8) == 0x30) {
                lVar10 = 1;
                do {
                  bVar1 = l2_char_stream_next_char(token_stream_p->char_stream_p);
                  if ((bVar1 & 0xf8) != 0x30) {
                    local_7c[lVar10] = 0;
                    l2_char_stream_rollback(token_stream_p->char_stream_p);
                    goto LAB_00102a3f;
                  }
                  local_7c[lVar10] = bVar1;
                  lVar10 = lVar10 + 1;
                } while (lVar10 != 3);
                lVar10 = 3;
LAB_00102a3f:
                local_7c[lVar10] = 0;
                iVar4 = l2_cast_octal_str_to_int((char *)local_7c);
                bVar1 = (byte)iVar4;
              }
              else if (bVar1 == 0x78) {
                local_7c[0] = l2_char_stream_next_char(char_stream_p);
                local_7c[1] = 0;
                if ((9 < (byte)(local_7c[0] - 0x30)) &&
                   ((0x25 < local_7c[0] - 0x41 ||
                    ((0x3f0000003fU >> ((ulong)(local_7c[0] - 0x41) & 0x3f) & 1) == 0)))) {
                  l2_char_stream_rollback(token_stream_p->char_stream_p);
                  l2_parsing_warning(L2_PARSING_WARNING_UNKNOWN_ESCAPE_SEQUENCE,iVar4,cols,local_7c)
                  ;
                  l2_string_push_char(&local_48,local_7c[0]);
                }
                local_7c[1] = l2_char_stream_next_char(token_stream_p->char_stream_p);
                if ((9 < (byte)(local_7c[1] - 0x30)) &&
                   ((0x25 < local_7c[1] - 0x41 ||
                    ((0x3f0000003fU >> ((ulong)(local_7c[1] - 0x41) & 0x3f) & 1) == 0)))) {
                  local_7c[1] = 0;
                  l2_char_stream_rollback(token_stream_p->char_stream_p);
                  uVar9 = 0x40;
                  goto switchD_001029ad_caseD_9;
                }
                local_7c[2] = 0;
                iVar4 = l2_cast_hex_str_to_int((char *)local_7c);
                bVar1 = (byte)iVar4;
              }
              else {
                if (bVar1 == 0xff) goto LAB_00103144;
                local_7c[1] = 0;
                local_7c[0] = bVar1;
                l2_parsing_warning(L2_PARSING_WARNING_UNKNOWN_ESCAPE_SEQUENCE,iVar4,cols,local_7c);
              }
              break;
            case 0x72:
              bVar1 = 0xd;
              break;
            case 0x74:
              bVar1 = 9;
              break;
            case 0x76:
              bVar1 = 0xb;
              break;
            default:
              if (bVar1 == 0x62) {
                bVar1 = 8;
              }
              else {
                if (bVar1 != 0x66) goto switchD_00102710_caseD_6f;
                bVar1 = 0xc;
              }
            }
          }
LAB_001025b5:
          l2_string_push_char(&local_48,bVar1);
          uVar9 = 0x400;
        }
        goto switchD_001029ad_caseD_9;
      }
      if (9 < (byte)(bVar1 - 0x30)) {
        pcVar6 = l2_string_get_str_p(&local_48);
        lStack_70.str_p = (char *)l2_cast_real_str_to_int(pcVar6);
        goto LAB_00102cd0;
      }
    }
    l2_string_push_char(&local_48,bVar1);
    uVar9 = 0x32;
    goto switchD_001029ad_caseD_9;
  }
  switch(uVar9) {
  case 0:
    local_58 = CONCAT44(iVar4,char_stream_p->chars_vector_current_pos);
    iStack_50 = cols;
    if (((byte)(bVar1 + 0xbf) < 0x1a) || (bVar1 == 0x5f || (byte)(bVar1 + 0x9f) < 0x1a)) {
      local_78 = 2;
      goto LAB_0010266c;
    }
    if (bVar1 == 0x30) {
      local_78 = 3;
      l2_string_push_char(&local_48,'0');
      uVar9 = 2;
      goto switchD_001029ad_caseD_9;
    }
    if ((byte)(bVar1 - 0x31) < 9) {
      local_78 = 3;
      goto LAB_00102633;
    }
    if (bVar1 < 0x5d) goto code_r0x0010299c;
    if (bVar1 < 0x7b) {
      if (bVar1 == 0x5d) {
        local_78 = 0xb;
        goto LAB_00102d15;
      }
      if (bVar1 == 0x5e) {
        local_78 = 0x20;
        cVar3 = l2_char_stream_next_char(char_stream_p);
        if (cVar3 != '=') break;
        local_78 = 0x30;
        goto LAB_00102d15;
      }
      goto switchD_001029ad_caseD_b;
    }
    switch(bVar1) {
    case 0x7b:
      local_78 = 6;
      goto LAB_00102d15;
    case 0x7c:
      local_78 = 0x21;
      cVar3 = l2_char_stream_next_char(char_stream_p);
      if (cVar3 == '=') {
        local_78 = 0x31;
        goto LAB_00102d15;
      }
      if (cVar3 == '|') {
        local_78 = 0x23;
        goto LAB_00102d15;
      }
      break;
    case 0x7d:
      local_78 = 7;
      goto LAB_00102d15;
    case 0x7e:
      local_78 = 0xe;
      goto LAB_00102d15;
    default:
      if (bVar1 == 0xff) {
        local_78 = 0;
        goto LAB_00102d15;
      }
      goto switchD_001029ad_caseD_b;
    }
    break;
  case 1:
    if ((((0x19 < (byte)(bVar1 + 0xbf)) && (9 < (byte)(bVar1 - 0x30))) && (bVar1 != 0x5f)) &&
       (0x19 < (byte)(bVar1 + 0x9f))) {
      l2_char_stream_rollback(char_stream_p);
      lVar10 = 0;
      goto LAB_00102c9e;
    }
LAB_0010266c:
    l2_string_push_char(&local_48,bVar1);
    uVar9 = 1;
    goto switchD_001029ad_caseD_9;
  case 2:
    if ((bVar1 & 0xdf) == 0x58) {
      l2_string_push_char(&local_48,bVar1);
      uVar9 = 0x20;
    }
    else {
      if (9 < (byte)(bVar1 - 0x30)) {
        if (bVar1 == 0x2e) goto LAB_00102752;
        lStack_70.str_p = (char *)((ulong)lStack_70.str_p & 0xffffffff00000000);
        goto LAB_00102cd4;
      }
LAB_001026ca:
      if (0x37 < bVar1) {
        uVar7 = (ulong)bVar1;
        lVar8 = L2_PARSING_ERROR_ILLEGAL_NUMBER_IN_AN_OCTAL_LITERAL;
        goto LAB_00103118;
      }
      l2_string_push_char(&local_48,bVar1);
      uVar9 = 0x21;
    }
    goto switchD_001029ad_caseD_9;
  case 3:
    if ((byte)(bVar1 - 0x30) < 10) {
LAB_00102633:
      l2_string_push_char(&local_48,bVar1);
      uVar9 = 3;
    }
    else {
      if (bVar1 != 0x2e) {
        pcVar6 = l2_string_get_str_p(&local_48);
        iVar4 = l2_cast_decimal_str_to_int(pcVar6);
        goto LAB_00102ccc;
      }
LAB_00102752:
      local_78 = 4;
      l2_string_push_char(&local_48,'.');
      uVar9 = 0x31;
    }
    goto switchD_001029ad_caseD_9;
  case 4:
    uVar9 = 0x40;
    if (bVar1 != 0x5c) {
      if (bVar1 != 0xff) {
        if (bVar1 == 0x27) {
          lVar8 = L2_PARSING_ERROR_EMPTY_CHARACTER_LITERAL;
          goto LAB_00103149;
        }
        goto LAB_001025b5;
      }
LAB_00103144:
      lVar8 = L2_PARSING_ERROR_INCOMPLETE_CHARACTER_LITERAL;
      goto LAB_00103149;
    }
    goto switchD_001029ad_caseD_9;
  case 5:
    uVar9 = 0x50;
    if (bVar1 != 0x5c) {
      if (bVar1 != 0x22) {
LAB_001026a0:
        if (bVar1 != 0xff) goto LAB_001026b2;
LAB_00103124:
        lVar8 = L2_PARSING_ERROR_INCOMPLETE_STRING_LITERAL;
LAB_00103149:
        l2_parsing_error(lVar8,iVar4,cols);
      }
      l2_string_push_char(&local_48,'\0');
      goto LAB_00102d15;
    }
    goto switchD_001029ad_caseD_9;
  default:
    if (uVar9 == 0x20) {
      if ((9 < (byte)(bVar1 - 0x30)) &&
         ((0x25 < bVar1 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar1 - 0x41) & 0x3f) & 1) == 0)))) {
        lVar8 = L2_PARSING_ERROR_INCOMPLETE_HEX_LITERAL;
        goto LAB_00103149;
      }
LAB_0010250c:
      l2_string_push_char(&local_48,bVar1);
      uVar9 = 0x200;
    }
    goto switchD_001029ad_caseD_9;
  }
  goto LAB_00102cd0;
  while (lVar10 = lVar10 + 8, lVar10 != 0x70) {
LAB_00102c9e:
    bVar2 = l2_string_equal_c(&local_48,*(char **)((long)g_l2_token_keywords + lVar10));
    if (bVar2 != '\0') {
      if (*(char **)((long)g_l2_token_keywords + lVar10) != (char *)0x0) {
        local_78 = 1;
        lStack_70.str_p = *(char **)((long)g_l2_token_keywords + lVar10);
        goto LAB_00102d15;
      }
      break;
    }
  }
  local_78 = 2;
LAB_00102d00:
  l2_string_create(&lStack_70);
  l2_string_strcpy(&lStack_70,&local_48);
  goto LAB_00102d15;
code_r0x0010299c:
  uVar9 = 0;
  switch(bVar1) {
  case 9:
  case 10:
  case 0xd:
  case 0x20:
    goto switchD_001029ad_caseD_9;
  case 0xb:
  case 0xc:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x23:
  case 0x24:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    goto switchD_001029ad_caseD_b;
  case 0x21:
    local_78 = 0xd;
    cVar3 = l2_char_stream_next_char(char_stream_p);
    if (cVar3 == '=') {
      local_78 = 0x1e;
      goto LAB_00102d15;
    }
    break;
  case 0x22:
    local_78 = 5;
    uVar9 = 5;
    goto switchD_001029ad_caseD_9;
  case 0x25:
    local_78 = 0x11;
    cVar3 = l2_char_stream_next_char(char_stream_p);
    if (cVar3 == '=') {
      local_78 = 0x2b;
      goto LAB_00102d15;
    }
    break;
  case 0x26:
    local_78 = 0x1f;
    cVar3 = l2_char_stream_next_char(char_stream_p);
    if (cVar3 == '=') {
      local_78 = 0x2f;
      goto LAB_00102d15;
    }
    if (cVar3 == '&') {
      local_78 = 0x22;
      goto LAB_00102d15;
    }
    break;
  case 0x27:
    local_78 = 3;
    uVar9 = 4;
    goto switchD_001029ad_caseD_9;
  case 0x28:
    local_78 = 8;
    goto LAB_00102d15;
  case 0x29:
    local_78 = 9;
    goto LAB_00102d15;
  case 0x2a:
    local_78 = 0xf;
    cVar3 = l2_char_stream_next_char(char_stream_p);
    if (cVar3 == '=') {
      local_78 = 0x29;
      goto LAB_00102d15;
    }
    break;
  case 0x2b:
    local_78 = 0x12;
    cVar3 = l2_char_stream_next_char(char_stream_p);
    if (cVar3 == '=') {
      local_78 = 0x27;
      goto LAB_00102d15;
    }
    if (cVar3 == '+') {
      local_78 = 0x13;
      goto LAB_00102d15;
    }
    break;
  case 0x2c:
    local_78 = 0x32;
    goto LAB_00102d15;
  case 0x2d:
    local_78 = 0x14;
    cVar3 = l2_char_stream_next_char(char_stream_p);
    if (cVar3 == '=') {
      local_78 = 0x28;
      goto LAB_00102d15;
    }
    if (cVar3 == '-') {
      local_78 = 0x15;
      goto LAB_00102d15;
    }
    break;
  case 0x2e:
    local_78 = 0xc;
    goto LAB_00102d15;
  case 0x2f:
    local_78 = 0x10;
    cVar3 = l2_char_stream_next_char(char_stream_p);
    if (cVar3 == '=') {
      local_78 = 0x2a;
      goto LAB_00102d15;
    }
    if (cVar3 == '/') goto LAB_00102e89;
    break;
  case 0x3a:
    local_78 = 0x25;
    goto LAB_00102d15;
  case 0x3b:
    local_78 = 0x33;
    goto LAB_00102d15;
  case 0x3c:
    local_78 = 0x1b;
    cVar3 = l2_char_stream_next_char(char_stream_p);
    if (cVar3 == '=') {
      local_78 = 0x1c;
      goto LAB_00102d15;
    }
    if (cVar3 == '<') {
      local_78 = 0x18;
      cVar3 = l2_char_stream_next_char(token_stream_p->char_stream_p);
      if (cVar3 == '=') {
        local_78 = 0x2e;
        goto LAB_00102d15;
      }
    }
    break;
  case 0x3d:
    local_78 = 0x26;
    cVar3 = l2_char_stream_next_char(char_stream_p);
    if (cVar3 == '=') {
      local_78 = 0x1d;
      goto LAB_00102d15;
    }
    break;
  case 0x3e:
    local_78 = 0x19;
    cVar3 = l2_char_stream_next_char(char_stream_p);
    if (cVar3 == '=') {
      local_78 = 0x1a;
      goto LAB_00102d15;
    }
    if (cVar3 == '>') {
      local_78 = 0x16;
      cVar3 = l2_char_stream_next_char(token_stream_p->char_stream_p);
      if (cVar3 == '=') {
        local_78 = 0x2c;
        goto LAB_00102d15;
      }
      if (cVar3 == '>') {
        local_78 = 0x17;
        cVar3 = l2_char_stream_next_char(token_stream_p->char_stream_p);
        if (cVar3 == '=') {
          local_78 = 0x2d;
          goto LAB_00102d15;
        }
      }
    }
    break;
  case 0x3f:
    local_78 = 0x24;
    goto LAB_00102d15;
  default:
    if (bVar1 == 0x5b) {
      local_78 = 10;
      goto LAB_00102d15;
    }
    goto switchD_001029ad_caseD_b;
  }
LAB_00102cd0:
  char_stream_p = token_stream_p->char_stream_p;
LAB_00102cd4:
  l2_char_stream_rollback(char_stream_p);
  goto LAB_00102d15;
switchD_001029ad_caseD_b:
  uVar7 = (ulong)(uint)(int)(char)bVar1;
  lVar8 = L2_PARSING_ERROR_ILLEGAL_CHARACTER;
LAB_00103118:
  l2_parsing_error(lVar8,iVar4,cols,uVar7);
  while (cVar3 != -1) {
LAB_00102e89:
    cVar3 = l2_char_stream_next_char(token_stream_p->char_stream_p);
    if (cVar3 == '\n') break;
  }
LAB_00102d15:
  l2_string_destroy(&local_48);
  l2_vector_append(&token_stream_p->token_vector,&local_78);
  token_stream_p->token_vector_current_pos = token_stream_p->token_vector_current_pos + 1;
  plVar5 = (l2_token *)l2_vector_tail(&token_stream_p->token_vector);
  return plVar5;
}

Assistant:

l2_token *l2_token_stream_next_token(l2_token_stream *token_stream_p) {
    l2_assert(token_stream_p, L2_INTERNAL_ERROR_NULL_POINTER);

    if (token_stream_p->token_vector_current_pos < token_stream_p->token_vector.size) {
        token_stream_p->token_vector_current_pos += 1;
        return (l2_token *)l2_vector_at(&token_stream_p->token_vector, token_stream_p->token_vector_current_pos - 1);
    }


    l2_token t = { 0 };
    int fa_state = 0x0;
    char ch = 0;
    l2_string token_str_buff;
    l2_string_create(&token_str_buff);

    while(1) {
        ch = l2_char_stream_next_char(token_stream_p->char_stream_p);

        int lines = token_stream_p->char_stream_p->lines;
        int cols = token_stream_p->char_stream_p->cols;

        switch (fa_state) {
            case 0x0:
                t.current_col = cols;
                t.current_line = lines;
                t.current_pos_at_stream = token_stream_p->char_stream_p->chars_vector_current_pos;

                if ((ch >= 'A' && ch <= 'Z') || (ch >= 'a' && ch <= 'z') || ch == '_') {
                    t.type = L2_TOKEN_IDENTIFIER;
                    l2_string_push_char(&token_str_buff, ch);
                    fa_state = 0x1;

                } else if (ch == '0') {
                    t.type = L2_TOKEN_INTEGER_LITERAL;
                    l2_string_push_char(&token_str_buff, ch);
                    fa_state = 0x2;

                } else if (ch >= '1' && ch <= '9') {
                    t.type = L2_TOKEN_INTEGER_LITERAL;
                    l2_string_push_char(&token_str_buff, ch);
                    fa_state = 0x3;

                } else if (ch == '\'') {
                    t.type = L2_TOKEN_INTEGER_LITERAL;
                    fa_state = 0x4;

                } else if (ch == '\"') {
                    t.type = L2_TOKEN_STRING_LITERAL;
                    fa_state = 0x5;

                } else if (ch == '{') {
                    t.type = L2_TOKEN_LBRACE;
                    goto ret;

                } else if (ch == '}') {
                    t.type = L2_TOKEN_RBRACE;
                    goto ret;

                } else if (ch == '(') {
                    t.type = L2_TOKEN_LP;
                    goto ret;

                } else if (ch == ')') {
                    t.type = L2_TOKEN_RP;
                    goto ret;

                } else if (ch == '[') {
                    t.type = L2_TOKEN_LBRACKET;
                    goto ret;

                } else if (ch == ']') {
                    t.type = L2_TOKEN_RBRACKET;
                    goto ret;

                } else if (ch == '.') {
                    t.type = L2_TOKEN_DOT;
                    goto ret;

                } else if (ch == '!') {
                    t.type = L2_TOKEN_LOGIC_NOT;
                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if (ch == '=') {
                        t.type = L2_TOKEN_NOT_EQUAL;
                    } else {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                    }
                    goto ret;

                } else if (ch == '~') {
                    t.type = L2_TOKEN_BIT_NOT;
                    goto ret;

                } else if (ch == '*') {
                    t.type = L2_TOKEN_MUL;
                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if (ch == '=') {
                        t.type = L2_TOKEN_MUL_ASSIGN;
                    } else {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                    }
                    goto ret;

                } else if (ch == '/') {
                    t.type = L2_TOKEN_DIV;
                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if (ch == '=') {
                        t.type = L2_TOKEN_DIV_ASSIGN;
                    } else if (ch == '/') {
						do {
							ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
						} while (ch != '\n' && ch != EOF);
		    		} else {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                    }
                    goto ret;

                } else if (ch == '%') {
                    t.type = L2_TOKEN_MOD;
                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if (ch == '=') {
                        t.type = L2_TOKEN_MOD_ASSIGN;
                    } else {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                    }
                    goto ret;

                } else if (ch == '+') {
                    t.type = L2_TOKEN_PLUS;
                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if (ch == '+') {
                        t.type = L2_TOKEN_INC;
                    } else if (ch == '=') {
                        t.type = L2_TOKEN_PLUS_ASSIGN;
                    } else {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                    }
                    goto ret;

                } else if (ch == '-') {
                    t.type = L2_TOKEN_SUB;
                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if (ch == '-') {
                        t.type = L2_TOKEN_DEC;
                    } else if (ch == '=') {
                        t.type = L2_TOKEN_SUB_ASSIGN;
                    } else {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                    }
                    goto ret;

                } else if (ch == '>') {
                    t.type = L2_TOKEN_GREAT_THAN;
                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if (ch == '>') {
                        t.type = L2_TOKEN_RSHIFT;
                        ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                        if (ch == '>') {
                            t.type = L2_TOKEN_RSHIFT_UNSIGNED;
                            ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                            if (ch == '=') {
                                t.type = L2_TOKEN_RSHIFT_UNSIGNED_ASSIGN;
                            } else {
                                l2_char_stream_rollback(token_stream_p->char_stream_p);
                            }
                        } else if (ch == '=') {
                            t.type = L2_TOKEN_RSHIFT_ASSIGN;
                        } else {
                            l2_char_stream_rollback(token_stream_p->char_stream_p);
                        }
                    } else if (ch == '=') {
                        t.type = L2_TOKEN_GREAT_EQUAL_THAN;
                    } else {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                    }
                    goto ret;

                } else if (ch == '<') {
                    t.type = L2_TOKEN_LESS_THAN;
                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if (ch == '<') {
                        t.type = L2_TOKEN_LSHIFT;
                        ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                        if (ch == '=') {
                            t.type = L2_TOKEN_LSHIFT_ASSIGN;
                        } else {
                            l2_char_stream_rollback(token_stream_p->char_stream_p);
                        }
                    } else if (ch == '=') {
                        t.type = L2_TOKEN_LESS_EQUAL_THAN;
                    } else {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                    }
                    goto ret;

                } else if (ch == '=') {
                    t.type = L2_TOKEN_ASSIGN;
                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if (ch == '=') {
                        t.type = L2_TOKEN_EQUAL;
                    } else {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                    }
                    goto ret;

                } else if (ch == '&') {
                    t.type = L2_TOKEN_BIT_AND;
                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if (ch == '&') {
                        t.type = L2_TOKEN_LOGIC_AND;
                    } else if (ch == '=') {
                        t.type = L2_TOKEN_BIT_AND_ASSIGN;
                    } else {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                    }
                    goto ret;

                } else if (ch == '^') {
                    t.type = L2_TOKEN_BIT_XOR;
                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if (ch == '=') {
                        t.type = L2_TOKEN_BIT_XOR_ASSIGN;
                    } else {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                    }
                    goto ret;

                } else if (ch == '|') {
                    t.type = L2_TOKEN_BIT_OR;
                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if (ch == '|') {
                        t.type = L2_TOKEN_LOGIC_OR;
                    } else if (ch == '=') {
                        t.type = L2_TOKEN_BIT_OR_ASSIGN;
                    } else {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                    }
                    goto ret;

                } else if (ch == '?') {
                    t.type = L2_TOKEN_QM;
                    goto ret;

                } else if (ch == ':') {
                    t.type = L2_TOKEN_COLON;
                    goto ret;

                } else if (ch == ',') {
                    t.type = L2_TOKEN_COMMA;
                    goto ret;

                } else if (ch == ';') {
                    t.type = L2_TOKEN_SEMICOLON;
                    goto ret;

                } else if (l2_char_is_blank(ch)) {

                } else if (ch == L2_EOF) {
                    t.type = L2_TOKEN_TERMINATOR;
                    goto ret;

                } else {
                    l2_parsing_error(L2_PARSING_ERROR_ILLEGAL_CHARACTER, lines, cols, ch);

                }

                break;

            case 0x1: /* handle identifier or keyword */
                if ((ch >= 'A' && ch <= 'Z') || (ch >= 'a' && ch <= 'z') || ch == '_' || (ch >= '0' && ch <= '9')) {
                    l2_string_push_char(&token_str_buff, ch);

                } else {
                    l2_char_stream_rollback(token_stream_p->char_stream_p);
                    char *keyword_p = l2_token_stream_str_keyword(&token_str_buff);
                    if (keyword_p) {
                        t.type = L2_TOKEN_KEYWORD;
                        //l2_string_destroy(&token_str_buff);
                        t.u.c_str = keyword_p;
                    } else {
                        t.type = L2_TOKEN_IDENTIFIER;
                        l2_string_create(&t.u.str);
                        l2_string_strcpy(&t.u.str, &token_str_buff);
                    }
                    goto ret;

                }
                break;

            case 0x2: /* handle oct and hex number literal ( begin with 0 ) */
                if (ch == 'X' || ch == 'x') {
                    l2_string_push_char(&token_str_buff, ch);
                    fa_state = 0x20;

                } else if (ch >= '0' && ch <= '9') {
                    if (ch >= '8') {
                        l2_parsing_error(L2_PARSING_ERROR_ILLEGAL_NUMBER_IN_AN_OCTAL_LITERAL, lines, cols, ch);
                    }
                    l2_string_push_char(&token_str_buff, ch);
                    fa_state = 0x21;

				} else if (ch == '.') {
					t.type = L2_TOKEN_REAL_LITERAL;
					l2_string_push_char(&token_str_buff, ch);
					fa_state = 0x31;

				} else { /* get 0 */
                    t.u.integer = 0;
                    l2_char_stream_rollback(token_stream_p->char_stream_p);
                    goto ret;

                }
                break;

            case 0x20: /* handle hex number literal */
                if ((ch >= '0' && ch <= '9') || (ch >= 'a' && ch <= 'f') || (ch >= 'A' && ch <= 'F')) {
                    l2_string_push_char(&token_str_buff, ch);
                    fa_state = 0x200;

                } else {
                    l2_parsing_error(L2_PARSING_ERROR_INCOMPLETE_HEX_LITERAL, lines, cols);

                }
                break;

            case 0x200: /* handle hex number literal */
                if ((ch >= '0' && ch <= '9') || (ch >= 'a' && ch <= 'f') || (ch >= 'A' && ch <= 'F')) {
                    l2_string_push_char(&token_str_buff, ch);

                } else {
                    t.u.integer = l2_cast_hex_str_to_int(&(l2_string_get_str_p(&token_str_buff)[2]));
                    l2_char_stream_rollback(token_stream_p->char_stream_p);
                    goto ret;

                }
                break;

            case 0x21: /* handle oct number literal */
                if (ch >= '0' && ch <= '9') {
                    if (ch >= '8') {
                        l2_parsing_error(L2_PARSING_ERROR_ILLEGAL_NUMBER_IN_AN_OCTAL_LITERAL, lines, cols, ch);
                    }
                    l2_string_push_char(&token_str_buff, ch);

                } else {
                    t.u.integer = l2_cast_octal_str_to_int(&(l2_string_get_str_p(&token_str_buff)[1]));
                    l2_char_stream_rollback(token_stream_p->char_stream_p);
                    goto ret;

                }
                break;

            case 0x3: /* handle dec number literal ( begin with 1 ~ 9 ) */
                if (ch >= '0' && ch <= '9') {
                    l2_string_push_char(&token_str_buff, ch);

                } else if (ch == '.') {
                    t.type = L2_TOKEN_REAL_LITERAL;
                    l2_string_push_char(&token_str_buff, ch);
                    fa_state = 0x31;

                } else {
                    t.u.integer = l2_cast_decimal_str_to_int(l2_string_get_str_p(&token_str_buff));
                    l2_char_stream_rollback(token_stream_p->char_stream_p);
                    goto ret;
                }
                break;

            case 0x31: /* handle real number literal ( begin with 1 ~ 9 ) */
                if (ch >= '0' && ch <= '9') {
                    l2_string_push_char(&token_str_buff, ch);
                    fa_state = 0x32;

                } else {
                    l2_parsing_error(L2_PARSING_ERROR_INCOMPLETE_REAL_LITERAL, lines, cols);
                }
                break;

            case 0x32: /* handle real number literal ( begin with 1 ~ 9 ) */
                if (ch >= '0' && ch <= '9') {
                    l2_string_push_char(&token_str_buff, ch);
                    fa_state = 0x32;

                } else {
                    t.u.real = l2_cast_real_str_to_int(l2_string_get_str_p(&token_str_buff));
                    l2_char_stream_rollback(token_stream_p->char_stream_p);
                    goto ret;
                }
                break;

            case 0x4: /* handle character literal */
                if (ch == '\'') {
                    l2_parsing_error(L2_PARSING_ERROR_EMPTY_CHARACTER_LITERAL, lines, cols);

                } else if (ch == '\\') {
                    fa_state = 0x40;

                } else if (ch == L2_EOF) {
                    l2_parsing_error(L2_PARSING_ERROR_INCOMPLETE_CHARACTER_LITERAL, lines, cols);

                } else {
                    l2_string_push_char(&token_str_buff, ch);
                    fa_state = 0x400;

                }
                break;

            case 0x40: /* handle escape character */
                if (ch == 'a') {
                    l2_string_push_char(&token_str_buff, '\a');

                } else if (ch == 'b') {
                    l2_string_push_char(&token_str_buff, '\b');

                } else if (ch == 'f') {
                    l2_string_push_char(&token_str_buff, '\f');

                } else if (ch == 'n') {
                    l2_string_push_char(&token_str_buff, '\n');

                } else if (ch == 'r') {
                    l2_string_push_char(&token_str_buff, '\r');

                } else if (ch == 't') {
                    l2_string_push_char(&token_str_buff, '\t');

                } else if (ch == 'v') {
                    l2_string_push_char(&token_str_buff, '\v');

                } else if (ch == '\\') {
                    l2_string_push_char(&token_str_buff, '\\');

                } else if (ch == '\'') {
                    l2_string_push_char(&token_str_buff, '\'');

                } else if (ch == '\"') {
                    l2_string_push_char(&token_str_buff, '\"');

                } else if (ch == '?') {
                    l2_string_push_char(&token_str_buff, '\?');

                } else if (ch >= '0' && ch <= '7') {
                    char seq[4];
                    int i;
                    for (i = 1; i < 3; i++) {
                        ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                        if (ch >= '0' && ch <= '7') {
                            seq[i] = ch;
                        } else {
                            seq[i] = '\0';
                            l2_char_stream_rollback(token_stream_p->char_stream_p);
                            break;
                        }
                    }
                    seq[i] = '\0';
                    l2_string_push_char(&token_str_buff, (char)l2_cast_octal_str_to_int(seq));
                    fa_state = 0x400;
                    break;

                } else if (ch == 'x') {
                    char seq[3];
                    seq[0] = ch = l2_char_stream_next_char(token_stream_p->char_stream_p); seq[1] = '\0';
                    if (!((ch >= '0' && ch <= '9') || (ch >= 'a' && ch <= 'f') || (ch >= 'A' && ch <= 'F'))) {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                        l2_parsing_warning(L2_PARSING_WARNING_UNKNOWN_ESCAPE_SEQUENCE, lines, cols, seq);
                        l2_string_push_char(&token_str_buff, seq[0]);
                    }

                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if ((ch >= '0' && ch <= '9') || (ch >= 'a' && ch <= 'f') || (ch >= 'A' && ch <= 'F')) {
                        seq[1] = ch;
                    } else {
                        seq[1] = '\0';
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                        break;
                    }
                    seq[2] = '\0';
                    l2_string_push_char(&token_str_buff, (char)l2_cast_hex_str_to_int(seq));
                    fa_state = 0x400;
                    break;

                } else if (ch == L2_EOF) {
                    l2_parsing_error(L2_PARSING_ERROR_INCOMPLETE_CHARACTER_LITERAL, lines, cols);

                } else {
                    char seq[2];
                    seq[0] = ch; seq[1] = '\0';
                    l2_parsing_warning(L2_PARSING_WARNING_UNKNOWN_ESCAPE_SEQUENCE, lines, cols, seq);
                    l2_string_push_char(&token_str_buff, ch);
                }

                fa_state = 0x400;

                break;

            case 0x400:
                if (ch == '\'') {
                    t.u.integer = l2_string_get_str_p(&token_str_buff)[0];
                    goto ret;

                } else if (ch == L2_EOF) {
                    l2_parsing_error(L2_PARSING_ERROR_INCOMPLETE_CHARACTER_LITERAL, lines, cols);

                } else {
                    l2_parsing_error(L2_PARSING_ERROR_MULTI_CHARACTER_IN_SINGLE_CHARACTER_LITERAL, lines, cols);

                }
                break;

            case 0x5: /* handle string literal */
                if (ch == '\"') {
                    l2_string_push_char(&token_str_buff, '\0');
                    goto ret;

                } else if (ch == '\\') {
                    fa_state = 0x50;

                } else if (ch == L2_EOF) {
                    l2_parsing_error(L2_PARSING_ERROR_INCOMPLETE_STRING_LITERAL, lines, cols);

                } else {
                    l2_string_push_char(&token_str_buff, ch);
                    fa_state = 0x500;
                }
                break;

            case 0x50: /* handle escape character in string literal */
                if (ch == 'a') {
                    l2_string_push_char(&token_str_buff, '\a');

                } else if (ch == 'b') {
                    l2_string_push_char(&token_str_buff, '\b');

                } else if (ch == 'f') {
                    l2_string_push_char(&token_str_buff, '\f');

                } else if (ch == 'n') {
                    l2_string_push_char(&token_str_buff, '\n');

                } else if (ch == 'r') {
                    l2_string_push_char(&token_str_buff, '\r');

                } else if (ch == 't') {
                    l2_string_push_char(&token_str_buff, '\t');

                } else if (ch == 'v') {
                    l2_string_push_char(&token_str_buff, '\v');

                } else if (ch == '\\') {
                    l2_string_push_char(&token_str_buff, '\\');

                } else if (ch == '\'') {
                    l2_string_push_char(&token_str_buff, '\'');

                } else if (ch == '\"') {
                    l2_string_push_char(&token_str_buff, '\"');

                } else if (ch == '?') {
                    l2_string_push_char(&token_str_buff, '\?');

                } else if (ch >= '0' && ch <= '7') {
                    char seq[4];
                    int i;
                    for (i = 1; i < 3; i++) {
                        ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                        if (ch >= '0' && ch <= '7') {
                            seq[i] = ch;
                        } else {
                            seq[i] = '\0';
                            l2_char_stream_rollback(token_stream_p->char_stream_p);
                            break;
                        }
                    }
                    seq[i] = '\0';
                    l2_string_push_char(&token_str_buff, (char)l2_cast_octal_str_to_int(seq));
                    fa_state = 0x500;
                    break;

                } else if (ch == 'x') {
                    char seq[3];
                    seq[0] = ch = l2_char_stream_next_char(token_stream_p->char_stream_p); seq[1] = '\0';
                    if (!((ch >= '0' && ch <= '9') || (ch >= 'a' && ch <= 'f') || (ch >= 'A' && ch <= 'F'))) {
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                        l2_parsing_warning(L2_PARSING_WARNING_UNKNOWN_ESCAPE_SEQUENCE, lines, cols, seq);
                        l2_string_push_char(&token_str_buff, seq[0]);
                    }

                    ch = l2_char_stream_next_char(token_stream_p->char_stream_p);
                    if ((ch >= '0' && ch <= '9') || (ch >= 'a' && ch <= 'f') || (ch >= 'A' && ch <= 'F')) {
                        seq[1] = ch;
                    } else {
                        seq[1] = '\0';
                        l2_char_stream_rollback(token_stream_p->char_stream_p);
                        l2_string_push_char(&token_str_buff, (char)l2_cast_hex_str_to_int(seq));
                        fa_state = 0x500;
                        break;
                    }
                    seq[2] = '\0';
                    l2_string_push_char(&token_str_buff, (char)l2_cast_hex_str_to_int(seq));
                    fa_state = 0x500;
                    break;

                } else if (ch == L2_EOF) {
                    l2_parsing_error(L2_PARSING_ERROR_INCOMPLETE_STRING_LITERAL, lines, cols);

                } else {
                    char seq[2];
                    seq[0] = ch; seq[1] = '\0';
                    l2_parsing_warning(L2_PARSING_WARNING_UNKNOWN_ESCAPE_SEQUENCE, lines, cols, seq);
                    l2_string_push_char(&token_str_buff, ch);
                }

                fa_state = 0x500;
                break;

            case 0x500:
                if (ch == '\"') {
                    l2_string_create(&t.u.str);
                    l2_string_strcpy(&t.u.str, &token_str_buff);
                    goto ret;

                } else if (ch == '\\') {
                    fa_state = 0x50;

                } else if (ch == L2_EOF) {
                    l2_parsing_error(L2_PARSING_ERROR_INCOMPLETE_STRING_LITERAL, lines, cols);

                } else {
                    l2_string_push_char(&token_str_buff, ch);
                }
                break;
        }


    }

    ret:

    l2_string_destroy(&token_str_buff);

    l2_vector_append(&token_stream_p->token_vector, &t);
    token_stream_p->token_vector_current_pos += 1;
    return (l2_token *)l2_vector_tail(&token_stream_p->token_vector);
}